

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O3

void __thiscall diffusion::FileWriter::FileWriter(FileWriter *this,string *file_name)

{
  ofstream *this_00;
  
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR_write_00105d00;
  this_00 = &this->file_;
  std::ofstream::ofstream(this_00);
  std::ofstream::open((string *)this_00,(_Ios_Openmode)file_name);
  std::ostream::write((char *)this_00,kFileHeader_abi_cxx11_);
  return;
}

Assistant:

FileWriter::FileWriter(std::string const & file_name) {
    try {
        file_.open(file_name);
    } catch (std::exception const & e) {
        throw ErrorFileOpening();
    }
    this->write_file_header();
}